

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
* __thiscall
cppcms::json::variant::
get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
          (variant *this)

{
  bad_value_cast *this_00;
  string local_40;
  
  if (this->type == is_object) {
    return (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            *)this;
  }
  this_00 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"invalid type","");
  bad_value_cast::bad_value_cast(this_00,&local_40,is_object,this->type);
  __cxa_throw(this_00,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

T const &get() const
		{
			json_type expected = json_type_traits<T>::type;
			if(expected != type) 
				throw bad_value_cast("invalid type",expected,type);
			switch(type) {
			case is_undefined:
			case is_null:
				throw bad_value_cast("non-fetchable type",type);
			default:
				return *static_cast<T const *>(ptr());
			}
		}